

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_commit.cxx
# Opt level: O0

void __thiscall
level_mesh::create_mappings
          (level_mesh *this,lw_face_vec *faces,lw_vmref_vec *vmrefs,xr_vmap_vec *vmaps,
          xr_remapper *face_remap,xr_remapper *vert_remap)

{
  undefined4 uVar1;
  bool bVar2;
  uint32_t uVar3;
  reference puVar4;
  const_reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  lw_vmref_entry local_134;
  undefined1 local_12c [8];
  lw_vmref vmref;
  lw_vmref_entry local_f8;
  xr_face_uv_vmap *local_f0 [3];
  undefined4 local_d8;
  uint local_d4;
  uint32_t vmref_idx;
  uint32_t tc;
  uint_fast32_t local_idx;
  const_reference pvStack_c0;
  uint32_t mapped_face_idx;
  b_face *face;
  undefined4 local_b0;
  uint32_t face_idx;
  uint32_t vmref0_idx;
  uint32_t tc0;
  lw_vmref vmref0;
  uint32_t mapped_vert_idx;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  const_iterator end;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  const_iterator it;
  xr_face_uv_vmap *pxStack_48;
  uint32_t vert_idx;
  xr_face_uv_vmap *face_uv_vmap;
  xr_uv_vmap *uv_vmap;
  xr_remapper *vert_remap_local;
  xr_remapper *face_remap_local;
  xr_vmap_vec *vmaps_local;
  lw_vmref_vec *vmrefs_local;
  lw_face_vec *faces_local;
  level_mesh *this_local;
  
  face_uv_vmap = (xr_face_uv_vmap *)0x0;
  pxStack_48 = (xr_face_uv_vmap *)0x0;
  it._M_current._4_4_ = xray_re::xr_remapper::min(vert_remap);
  end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                  (&(this->super_xr_mesh_builder).m_vertex_faces);
  local_58 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&end,(ulong)it._M_current._4_4_);
  register0x00000000 =
       std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                 (&(this->super_xr_mesh_builder).m_vertex_faces);
  uVar3 = xray_re::xr_remapper::max(vert_remap);
  local_70 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&vmref0.count,(ulong)uVar3);
  local_68 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator+(&local_70,1);
  do {
    bVar2 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar2) {
      return;
    }
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_58);
    if ((*puVar4 != 0xffffffff) &&
       (vmref0.array[4].offset = xray_re::xr_remapper::operator[](vert_remap,it._M_current._4_4_),
       vmref0.array[4].offset != 0xffffffff)) {
      xray_re::_svector<xray_re::lw_vmref_entry,_5U>::_svector
                ((_svector<xray_re::lw_vmref_entry,_5U> *)&vmref0_idx);
      face_idx = 0xffffffff;
      local_b0 = 0;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_58);
      face._4_4_ = *puVar4;
      while (face._4_4_ != 0xffffffff) {
        pvStack_c0 = std::
                     vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                     ::operator[](&(this->super_xr_mesh_builder).m_faces,(ulong)face._4_4_);
        local_idx._4_4_ = xray_re::xr_remapper::operator[](face_remap,face._4_4_);
        if (local_idx._4_4_ == 0xffffffff) {
          face._4_4_ = xray_re::xr_mesh_builder::b_face::next_face_idx
                                 (pvStack_c0,(ulong)it._M_current._4_4_);
        }
        else {
          _vmref_idx = xray_re::xr_mesh_builder::b_face::local_vert_idx
                                 (pvStack_c0,(ulong)it._M_current._4_4_);
          local_d4 = *(uint *)((long)&pvStack_c0->field_0 + _vmref_idx * 4 + 0x18);
          if (local_d4 == 0xffffffff) {
            __assert_fail("tc != BAD_IDX",
                          "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_commit.cxx"
                          ,0x3a,
                          "void level_mesh::create_mappings(lw_face_vec &, lw_vmref_vec &, xr_vmap_vec &, const xr_remapper &, const xr_remapper &) const"
                         );
          }
          if (face_idx == 0xffffffff) {
            if (face_uv_vmap == (xr_face_uv_vmap *)0x0) {
              face_uv_vmap = (xr_face_uv_vmap *)operator_new(0x58);
              xray_re::xr_uv_vmap::xr_uv_vmap((xr_uv_vmap *)face_uv_vmap,"Texture");
              local_f0[0] = face_uv_vmap;
              std::vector<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>::push_back
                        (vmaps,(value_type *)local_f0);
            }
            face_idx = local_d4;
            pvVar5 = std::
                     vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
                     operator[](&(this->super_xr_mesh_builder).m_texcoords,(ulong)local_d4);
            uVar3 = xray_re::xr_uv_vmap::add_uv
                              (&face_uv_vmap->super_xr_uv_vmap,pvVar5,vmref0.array[4].offset);
            xray_re::lw_vmref_entry::lw_vmref_entry(&local_f8,0,uVar3);
            xray_re::_svector<xray_re::lw_vmref_entry,_5U>::push_back
                      ((_svector<xray_re::lw_vmref_entry,_5U> *)&vmref0_idx,&local_f8);
            sVar6 = std::
                    vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                    ::size(vmrefs);
            local_d8 = (undefined4)sVar6;
            local_b0 = local_d8;
            std::
            vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
            ::push_back(vmrefs,(value_type *)&vmref0_idx);
          }
          else if (face_idx == local_d4) {
            local_d8 = local_b0;
          }
          else {
            if (pxStack_48 == (xr_face_uv_vmap *)0x0) {
              pxStack_48 = (xr_face_uv_vmap *)operator_new(0x70);
              xray_re::xr_face_uv_vmap::xr_face_uv_vmap(pxStack_48,"Texture");
              vmref._36_8_ = pxStack_48;
              std::vector<xray_re::xr_vmap_*,_std::allocator<xray_re::xr_vmap_*>_>::push_back
                        (vmaps,(value_type *)&vmref.array[4].offset);
            }
            xray_re::_svector<xray_re::lw_vmref_entry,_5U>::_svector
                      ((_svector<xray_re::lw_vmref_entry,_5U> *)local_12c);
            pvVar5 = std::
                     vector<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>::
                     operator[](&(this->super_xr_mesh_builder).m_texcoords,(ulong)local_d4);
            uVar3 = xray_re::xr_face_uv_vmap::add_uv
                              (pxStack_48,pvVar5,vmref0.array[4].offset,local_idx._4_4_);
            xray_re::lw_vmref_entry::lw_vmref_entry(&local_134,1,uVar3);
            xray_re::_svector<xray_re::lw_vmref_entry,_5U>::push_back
                      ((_svector<xray_re::lw_vmref_entry,_5U> *)local_12c,&local_134);
            sVar6 = std::
                    vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                    ::size(vmrefs);
            local_d8 = (undefined4)sVar6;
            std::
            vector<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
            ::push_back(vmrefs,(value_type *)local_12c);
          }
          uVar1 = local_d8;
          pvVar7 = std::vector<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>::operator[]
                             (faces,(ulong)local_idx._4_4_);
          *(undefined4 *)((long)&pvVar7->field_0 + _vmref_idx * 4 + 0xc) = uVar1;
          face._4_4_ = *(uint *)((long)&pvStack_c0->field_0 + _vmref_idx * 4 + 0x24);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_58);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  } while( true );
}

Assistant:

void level_mesh::create_mappings(lw_face_vec& faces, lw_vmref_vec& vmrefs, xr_vmap_vec& vmaps,
		const xr_remapper& face_remap, const xr_remapper& vert_remap) const
{
	xr_uv_vmap* uv_vmap = 0;
	xr_face_uv_vmap* face_uv_vmap = 0;
	uint32_t vert_idx = vert_remap.min();
	for (std::vector<uint32_t>::const_iterator it = m_vertex_faces.begin() + vert_idx,
			end = m_vertex_faces.begin() + vert_remap.max() + 1; it != end; ++it, ++vert_idx) {
		if (*it == BAD_IDX)
			continue;
		uint32_t mapped_vert_idx = vert_remap[vert_idx];
		if (mapped_vert_idx == BAD_IDX)
			continue;

		lw_vmref vmref0;
		uint32_t tc0 = BAD_IDX, vmref0_idx = 0;
		for (uint32_t face_idx = *it; face_idx != BAD_IDX;) {
			const b_face& face = m_faces[face_idx];
			uint32_t mapped_face_idx = face_remap[face_idx];
			if (mapped_face_idx == BAD_IDX) {
				face_idx = face.next_face_idx(vert_idx);
				continue;
			}
			uint_fast32_t local_idx = face.local_vert_idx(vert_idx);
			uint32_t tc = face.tc[local_idx], vmref_idx;
			xr_assert(tc != BAD_IDX);
			if (tc0 == BAD_IDX) {
				if (uv_vmap == 0) {
					uv_vmap = new xr_uv_vmap("Texture");
					vmaps.push_back(uv_vmap);
				}
				vmref0.push_back(lw_vmref_entry(0, uv_vmap->add_uv(
						m_texcoords[tc0 = tc], mapped_vert_idx)));
				vmref0_idx = vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref0);
			} else if (tc0 == tc) {
				vmref_idx = vmref0_idx;
			} else {
				if (face_uv_vmap == 0) {
					face_uv_vmap = new xr_face_uv_vmap("Texture");
					vmaps.push_back(face_uv_vmap);
				}
				lw_vmref vmref;
				vmref.push_back(lw_vmref_entry(1, face_uv_vmap->add_uv(
						m_texcoords[tc], mapped_vert_idx, mapped_face_idx)));
				vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref);
			}
			faces[mapped_face_idx].ref[local_idx] = vmref_idx;
			face_idx = face.link[local_idx];
		}
	}
#if 0
	for (lw_face_vec_it it = faces.begin(); it != faces.end(); ++it) {
		if (it->ref0 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref1 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref2 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		xr_assert(it->ref0 < vmrefs.size());
		xr_assert(it->ref1 < vmrefs.size());
		xr_assert(it->ref2 < vmrefs.size());
	}
#endif
}